

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fees.cpp
# Opt level: O2

void __thiscall
CBlockPolicyEstimator::CBlockPolicyEstimator
          (CBlockPolicyEstimator *this,path *estimation_filepath,bool read_stale_estimates)

{
  _Rb_tree_header *p_Var1;
  vector<double,_std::allocator<double>_> *this_00;
  map<double,_unsigned_int,_std::less<double>,_std::allocator<std::pair<const_double,_unsigned_int>_>_>
  *this_01;
  string_view source_file;
  bool bVar2;
  mapped_type_conflict *pmVar3;
  TxConfirmStats *pTVar4;
  hours hVar5;
  Logger *pLVar6;
  path *this_02;
  string *this_03;
  long *in_R9;
  pointer __p;
  mapped_type_conflict mVar7;
  long in_FS_OFFSET;
  string_view str;
  string_view source_file_00;
  string_view source_file_01;
  string_view logging_function;
  string_view logging_function_00;
  string_view logging_function_01;
  long local_148;
  undefined1 local_140 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_130;
  AutoFile local_120;
  string local_f8 [4];
  string local_78;
  double bucketBoundary;
  size_t local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (this->super_CValidationInterface)._vptr_CValidationInterface =
       (_func_int **)&PTR_UpdatedBlockTip_011528e0;
  this_02 = &this->m_estimation_filepath;
  std::filesystem::__cxx11::path::path(&this_02->super_path,&estimation_filepath->super_path);
  p_Var1 = &(this->mapMemPoolTxs)._M_t._M_impl.super__Rb_tree_header;
  (this->mapMemPoolTxs)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->mapMemPoolTxs)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_cs_fee_estimator).super_mutex.super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->m_cs_fee_estimator).super_mutex.super___mutex_base._M_mutex + 8) = 0
  ;
  this->historicalFirst = 0;
  this->historicalBest = 0;
  *(undefined8 *)((long)&(this->m_cs_fee_estimator).super_mutex.super___mutex_base._M_mutex + 0x10)
       = 0;
  (this->m_cs_fee_estimator).super_mutex.super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->m_cs_fee_estimator).super_mutex.super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  this->nBestSeenHeight = 0;
  this->firstRecordedHeight = 0;
  (this->mapMemPoolTxs)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->mapMemPoolTxs)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  this_00 = &this->buckets;
  p_Var1 = &(this->bucketMap)._M_t._M_impl.super__Rb_tree_header;
  (this->bucketMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->bucketMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->mapMemPoolTxs)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->feeStats)._M_t.super___uniq_ptr_impl<TxConfirmStats,_std::default_delete<TxConfirmStats>_>.
  _M_t.super__Tuple_impl<0UL,_TxConfirmStats_*,_std::default_delete<TxConfirmStats>_>.
  super__Head_base<0UL,_TxConfirmStats_*,_false>._M_head_impl = (TxConfirmStats *)0x0;
  (this->shortStats)._M_t.
  super___uniq_ptr_impl<TxConfirmStats,_std::default_delete<TxConfirmStats>_>._M_t.
  super__Tuple_impl<0UL,_TxConfirmStats_*,_std::default_delete<TxConfirmStats>_>.
  super__Head_base<0UL,_TxConfirmStats_*,_false>._M_head_impl = (TxConfirmStats *)0x0;
  (this->longStats)._M_t.super___uniq_ptr_impl<TxConfirmStats,_std::default_delete<TxConfirmStats>_>
  ._M_t.super__Tuple_impl<0UL,_TxConfirmStats_*,_std::default_delete<TxConfirmStats>_>.
  super__Head_base<0UL,_TxConfirmStats_*,_false>._M_head_impl = (TxConfirmStats *)0x0;
  this->trackedTxs = 0;
  this->untrackedTxs = 0;
  (this->buckets).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->buckets).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->buckets).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->bucketMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->bucketMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->bucketMap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this_01 = &this->bucketMap;
  mVar7 = 0;
  for (bucketBoundary = 1000.0; bucketBoundary <= 10000000.0; bucketBoundary = bucketBoundary * 1.05
      ) {
    std::vector<double,_std::allocator<double>_>::push_back(this_00,&bucketBoundary);
    pmVar3 = std::
             map<double,_unsigned_int,_std::less<double>,_std::allocator<std::pair<const_double,_unsigned_int>_>_>
             ::operator[](this_01,&bucketBoundary);
    *pmVar3 = mVar7;
    mVar7 = mVar7 + 1;
  }
  std::vector<double,_std::allocator<double>_>::push_back(this_00,&INF_FEERATE);
  pmVar3 = std::
           map<double,_unsigned_int,_std::less<double>,_std::allocator<std::pair<const_double,_unsigned_int>_>_>
           ::operator[](this_01,&INF_FEERATE);
  *pmVar3 = mVar7;
  if ((this->bucketMap)._M_t._M_impl.super__Rb_tree_header._M_node_count !=
      (long)(this->buckets).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)(this->buckets).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start >> 3) {
    __assert_fail("bucketMap.size() == buckets.size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/policy/fees.cpp"
                  ,0x227,
                  "CBlockPolicyEstimator::CBlockPolicyEstimator(const fs::path &, const bool)");
  }
  pTVar4 = (TxConfirmStats *)operator_new(0xb0);
  TxConfirmStats::TxConfirmStats(pTVar4,this_00,this_01,0x18,0.9952,2);
  bucketBoundary = 0.0;
  std::__uniq_ptr_impl<TxConfirmStats,_std::default_delete<TxConfirmStats>_>::reset
            ((__uniq_ptr_impl<TxConfirmStats,_std::default_delete<TxConfirmStats>_> *)
             &this->feeStats,pTVar4);
  std::unique_ptr<TxConfirmStats,_std::default_delete<TxConfirmStats>_>::~unique_ptr
            ((unique_ptr<TxConfirmStats,_std::default_delete<TxConfirmStats>_> *)&bucketBoundary);
  pTVar4 = (TxConfirmStats *)operator_new(0xb0);
  TxConfirmStats::TxConfirmStats(pTVar4,this_00,this_01,0xc,0.962,1);
  bucketBoundary = 0.0;
  std::__uniq_ptr_impl<TxConfirmStats,_std::default_delete<TxConfirmStats>_>::reset
            ((__uniq_ptr_impl<TxConfirmStats,_std::default_delete<TxConfirmStats>_> *)
             &this->shortStats,pTVar4);
  std::unique_ptr<TxConfirmStats,_std::default_delete<TxConfirmStats>_>::~unique_ptr
            ((unique_ptr<TxConfirmStats,_std::default_delete<TxConfirmStats>_> *)&bucketBoundary);
  pTVar4 = (TxConfirmStats *)operator_new(0xb0);
  TxConfirmStats::TxConfirmStats(pTVar4,this_00,this_01,0x2a,0.99931,0x18);
  bucketBoundary = 0.0;
  std::__uniq_ptr_impl<TxConfirmStats,_std::default_delete<TxConfirmStats>_>::reset
            ((__uniq_ptr_impl<TxConfirmStats,_std::default_delete<TxConfirmStats>_> *)
             &this->longStats,pTVar4);
  std::unique_ptr<TxConfirmStats,_std::default_delete<TxConfirmStats>_>::~unique_ptr
            ((unique_ptr<TxConfirmStats,_std::default_delete<TxConfirmStats>_> *)&bucketBoundary);
  local_120.m_file = (FILE *)fsbridge::fopen((char *)this_02,"rb");
  local_120.m_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_120.m_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_120.m_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_140._8_8_ = 0;
  aStack_130._M_allocated_capacity = 0;
  aStack_130._8_8_ = 0;
  std::_Vector_base<std::byte,_std::allocator<std::byte>_>::~_Vector_base
            ((_Vector_base<std::byte,_std::allocator<std::byte>_> *)(local_140 + 8));
  if ((FILE *)local_120.m_file == (FILE *)0x0) {
    std::filesystem::__cxx11::path::string((string *)&bucketBoundary,&this_02->super_path);
    source_file_01._M_str =
         "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/policy/fees.cpp";
    source_file_01._M_len = 0x58;
    logging_function_00._M_str = "CBlockPolicyEstimator";
    logging_function_00._M_len = 0x15;
    ::LogPrintf_<std::__cxx11::string>
              (logging_function_00,source_file_01,0x230,ALL,Info,
               "%s is not found. Continue anyway.\n",(string *)&bucketBoundary);
LAB_007c288e:
    this_03 = (string *)&bucketBoundary;
  }
  else {
    hVar5 = GetFeeEstimatorFileAge(this);
    if (hVar5.__r < 0x3d || read_stale_estimates) {
      bVar2 = Read(this,&local_120);
      if (bVar2) goto LAB_007c29a5;
      std::filesystem::__cxx11::path::string((string *)&bucketBoundary,&this_02->super_path);
      source_file_00._M_str =
           "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/policy/fees.cpp"
      ;
      source_file_00._M_len = 0x58;
      logging_function._M_str = "CBlockPolicyEstimator";
      logging_function._M_len = 0x15;
      ::LogPrintf_<std::__cxx11::string>
                (logging_function,source_file_00,0x23b,ALL,Info,
                 "Failed to read fee estimates from %s. Continue anyway.\n",
                 (string *)&bucketBoundary);
      goto LAB_007c288e;
    }
    std::filesystem::__cxx11::path::string(local_f8,&this_02->super_path);
    local_148 = 0x3c;
    local_140._0_8_ = hVar5;
    pLVar6 = LogInstance();
    bVar2 = BCLog::Logger::Enabled(pLVar6);
    if (bVar2) {
      bucketBoundary = (double)&local_48;
      local_50 = 0;
      local_48._M_local_buf[0] = '\0';
      tinyformat::format<std::__cxx11::string,long,long>
                (&local_78,
                 (tinyformat *)
                 "Fee estimation file %s too old (age=%lld > %lld hours) and will not be used to avoid serving stale estimates.\n"
                 ,(char *)local_f8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_140,
                 &local_148,in_R9);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &bucketBoundary,&local_78);
      std::__cxx11::string::~string((string *)&local_78);
      pLVar6 = LogInstance();
      local_78._M_dataplus._M_p = &DAT_00000058;
      local_78._M_string_length = 0xccc4d7;
      source_file._M_str =
           "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/policy/fees.cpp"
      ;
      source_file._M_len = 0x58;
      str._M_str = (char *)bucketBoundary;
      str._M_len = local_50;
      logging_function_01._M_str = "CBlockPolicyEstimator";
      logging_function_01._M_len = 0x15;
      BCLog::Logger::LogPrintStr(pLVar6,str,logging_function_01,source_file,0x236,ALL,Info);
      std::__cxx11::string::~string((string *)&bucketBoundary);
    }
    this_03 = local_f8;
  }
  std::__cxx11::string::~string((string *)this_03);
LAB_007c29a5:
  AutoFile::~AutoFile(&local_120);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

CBlockPolicyEstimator::CBlockPolicyEstimator(const fs::path& estimation_filepath, const bool read_stale_estimates)
    : m_estimation_filepath{estimation_filepath}
{
    static_assert(MIN_BUCKET_FEERATE > 0, "Min feerate must be nonzero");
    size_t bucketIndex = 0;

    for (double bucketBoundary = MIN_BUCKET_FEERATE; bucketBoundary <= MAX_BUCKET_FEERATE; bucketBoundary *= FEE_SPACING, bucketIndex++) {
        buckets.push_back(bucketBoundary);
        bucketMap[bucketBoundary] = bucketIndex;
    }
    buckets.push_back(INF_FEERATE);
    bucketMap[INF_FEERATE] = bucketIndex;
    assert(bucketMap.size() == buckets.size());

    feeStats = std::unique_ptr<TxConfirmStats>(new TxConfirmStats(buckets, bucketMap, MED_BLOCK_PERIODS, MED_DECAY, MED_SCALE));
    shortStats = std::unique_ptr<TxConfirmStats>(new TxConfirmStats(buckets, bucketMap, SHORT_BLOCK_PERIODS, SHORT_DECAY, SHORT_SCALE));
    longStats = std::unique_ptr<TxConfirmStats>(new TxConfirmStats(buckets, bucketMap, LONG_BLOCK_PERIODS, LONG_DECAY, LONG_SCALE));

    AutoFile est_file{fsbridge::fopen(m_estimation_filepath, "rb")};

    if (est_file.IsNull()) {
        LogPrintf("%s is not found. Continue anyway.\n", fs::PathToString(m_estimation_filepath));
        return;
    }

    std::chrono::hours file_age = GetFeeEstimatorFileAge();
    if (file_age > MAX_FILE_AGE && !read_stale_estimates) {
        LogPrintf("Fee estimation file %s too old (age=%lld > %lld hours) and will not be used to avoid serving stale estimates.\n", fs::PathToString(m_estimation_filepath), Ticks<std::chrono::hours>(file_age), Ticks<std::chrono::hours>(MAX_FILE_AGE));
        return;
    }

    if (!Read(est_file)) {
        LogPrintf("Failed to read fee estimates from %s. Continue anyway.\n", fs::PathToString(m_estimation_filepath));
    }
}